

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void __thiscall
bloaty::macho::MaybeAddOverhead(macho *this,RangeSink *sink,char *label,string_view data)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  string_view name;
  
  uVar3 = data._M_len;
  if (this != (macho *)0x0) {
    uVar1 = *(ulong *)(*(long *)this + 0x30);
    if ((uVar1 <= uVar3) && (uVar3 < *(long *)(*(long *)this + 0x28) + uVar1)) {
      sVar2 = strlen((char *)sink);
      name._M_str = (char *)sink;
      name._M_len = sVar2;
      RangeSink::AddFileRange((RangeSink *)this,"macho_overhead",name,uVar3 - uVar1,(uint64_t)label)
      ;
      return;
    }
  }
  return;
}

Assistant:

void MaybeAddOverhead(RangeSink* sink, const char* label, string_view data) {
  if (sink) {
    sink->AddFileRange("macho_overhead", label, data);
  }
}